

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
CP::vector<std::pair<int,_int>_>::resize(vector<std::pair<int,_int>_> *this,size_t n)

{
  pair<int,_int> local_28;
  size_t i;
  pair<int,_int> init;
  size_t n_local;
  vector<std::pair<int,_int>_> *this_local;
  
  init = (pair<int,_int>)n;
  if (this->mCap < n) {
    expand(this,n);
  }
  if (this->mSize < (ulong)init) {
    std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)&i);
    for (local_28 = (pair<int,_int>)this->mSize; (ulong)local_28 < (ulong)init;
        local_28 = (pair<int,_int>)((long)local_28 + 1)) {
      std::pair<int,_int>::operator=(this->mData + (long)local_28,(type)&i);
    }
  }
  this->mSize = (size_t)init;
  return;
}

Assistant:

void resize(size_t n) {
      if (n > mCap)
        expand(n);

      if (n > mSize) {
        T init = T();
        for (size_t i = mSize;i < n;i++) 
          mData[i] = init;
      }


      mSize = n;
    }